

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_grp.c
# Opt level: O3

void * GRP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  int iVar1;
  void *opaque;
  char *pcVar2;
  void *pvVar3;
  PHYSFS_uint32 PVar4;
  PHYSFS_ErrorCode errcode;
  uint uVar5;
  PHYSFS_uint32 count;
  PHYSFS_uint8 buf [12];
  char name_1 [13];
  PHYSFS_uint32 local_54;
  PHYSFS_uint32 local_50;
  long local_49;
  int local_41;
  char local_3d [12];
  undefined1 local_31;
  
  local_54 = 0;
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/REGoth-project[P]physfs/src/physfs_archiver_grp.c"
                  ,0x42,"void *GRP_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting == 0) {
    iVar1 = __PHYSFS_readAll(io,&local_49,0xc);
    if (iVar1 == 0) {
      return (void *)0x0;
    }
    if (local_41 == 0x6e616d72 && local_49 == 0x65766c69536e654b) {
      *claimed = 1;
      iVar1 = __PHYSFS_readAll(io,&local_54,4);
      if (iVar1 == 0) {
        return (void *)0x0;
      }
      local_54 = PHYSFS_swapULE32(local_54);
      opaque = UNPK_openArchive(io);
      if (opaque == (void *)0x0) {
        return (void *)0x0;
      }
      if (local_54 == 0) {
        return opaque;
      }
      uVar5 = local_54 * 0x10 + 0x10;
      PVar4 = local_54;
      while ((iVar1 = __PHYSFS_readAll(io,local_3d,0xc), iVar1 != 0 &&
             (iVar1 = __PHYSFS_readAll(io,&local_50,4), iVar1 != 0))) {
        local_31 = 0;
        pcVar2 = strchr(local_3d,0x20);
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
        local_50 = PHYSFS_swapULE32(local_50);
        pvVar3 = UNPK_addEntry(opaque,local_3d,0,-1,-1,(ulong)uVar5,(ulong)local_50);
        if (pvVar3 == (void *)0x0) break;
        uVar5 = uVar5 + local_50;
        PVar4 = PVar4 - 1;
        if (PVar4 == 0) {
          return opaque;
        }
      }
      UNPK_abandonArchive(opaque);
      return (void *)0x0;
    }
    errcode = PHYSFS_ERR_UNSUPPORTED;
  }
  else {
    errcode = PHYSFS_ERR_READ_ONLY;
  }
  PHYSFS_setErrorCode(errcode);
  return (void *)0x0;
}

Assistant:

static void *GRP_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    PHYSFS_uint8 buf[12];
    PHYSFS_uint32 count = 0;
    void *unpkarc = NULL;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, buf, sizeof (buf)), NULL);
    if (memcmp(buf, "KenSilverman", sizeof (buf)) != 0)
        BAIL(PHYSFS_ERR_UNSUPPORTED, NULL);

    *claimed = 1;

    BAIL_IF_ERRPASS(!__PHYSFS_readAll(io, &count, sizeof(count)), NULL);
    count = PHYSFS_swapULE32(count);

    unpkarc = UNPK_openArchive(io);
    BAIL_IF_ERRPASS(!unpkarc, NULL);

    if (!grpLoadEntries(io, count, unpkarc))
    {
        UNPK_abandonArchive(unpkarc);
        return NULL;
    } /* if */

    return unpkarc;
}